

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::MidiMessage(MidiMessage *this,MidiMessage *message)

{
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (this != message) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               &message->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  return;
}

Assistant:

MidiMessage& MidiMessage::operator=(const std::vector<uchar>& bytes) {
	if (this == &bytes) {
		return *this;
	}
	setMessage(bytes);
	return *this;
}